

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O1

int __thiscall wasm::UnneededSetRemover::remove(UnneededSetRemover *this,char *__filename)

{
  Expression *expression;
  bool bVar1;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  uintptr_t extraout_RAX_01;
  uintptr_t uVar2;
  byte bVar3;
  Drop *output;
  EffectAnalyzer local_1a0;
  
  expression = *(Expression **)(__filename + 0x18);
  bVar1 = LocalSet::isTee((LocalSet *)__filename);
  if (bVar1) {
    Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::replaceCurrent
              ((Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_> *)
               this,expression);
    uVar2 = (expression->type).id;
    if (uVar2 != *(uintptr_t *)(__filename + 8)) {
      this->refinalize = true;
    }
  }
  else {
    EffectAnalyzer::EffectAnalyzer
              (&local_1a0,this->passOptions,this->module,*(Expression **)(__filename + 0x18));
    bVar3 = 1;
    if (((((local_1a0.trap == false) &&
          (local_1a0.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
         (local_1a0.danglingPop == false)) &&
        ((((local_1a0.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
           (local_1a0.writesMemory == false)) &&
          ((local_1a0.writesTable == false &&
           ((local_1a0.writesStruct == false && (local_1a0.writesArray == false)))))) &&
         (local_1a0.isAtomic == false)))) &&
       (((local_1a0.calls == false && (local_1a0.throws_ == false)) &&
        (local_1a0.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
      bVar3 = local_1a0.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 |
              local_1a0.branchesOut;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1a0.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1a0.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1a0.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_1a0.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1a0.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_1a0.localsRead._M_t);
    uVar2 = extraout_RAX;
    if (local_1a0.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a0.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      uVar2 = extraout_RAX_00;
    }
    if (bVar3 == 0) {
      __filename[0] = '\x16';
      __filename[1] = '\0';
      __filename[2] = '\0';
      __filename[3] = '\0';
      __filename[8] = '\0';
      __filename[9] = '\0';
      __filename[10] = '\0';
      __filename[0xb] = '\0';
      __filename[0xc] = '\0';
      __filename[0xd] = '\0';
      __filename[0xe] = '\0';
      __filename[0xf] = '\0';
    }
    else {
      __filename[0] = '\x12';
      __filename[1] = '\0';
      __filename[2] = '\0';
      __filename[3] = '\0';
      __filename[8] = '\0';
      __filename[9] = '\0';
      __filename[10] = '\0';
      __filename[0xb] = '\0';
      __filename[0xc] = '\0';
      __filename[0xd] = '\0';
      __filename[0xe] = '\0';
      __filename[0xf] = '\0';
      *(Expression **)(__filename + 0x10) = expression;
      Drop::finalize((Drop *)__filename);
      uVar2 = extraout_RAX_01;
    }
  }
  this->removed = true;
  return (int)uVar2;
}

Assistant:

void remove(LocalSet* set) {
    auto* value = set->value;
    if (set->isTee()) {
      replaceCurrent(value);
      if (value->type != set->type) {
        // The value is more refined, so we'll need to refinalize.
        refinalize = true;
      }
    } else if (EffectAnalyzer(passOptions, module, set->value)
                 .hasSideEffects()) {
      Drop* drop = ExpressionManipulator::convert<LocalSet, Drop>(set);
      drop->value = value;
      drop->finalize();
    } else {
      ExpressionManipulator::nop(set);
    }
    removed = true;
  }